

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O3

float golf_config_get_num(golf_config_t *cfg,char *name)

{
  golf_config_property_t *pgVar1;
  float fVar2;
  
  pgVar1 = (golf_config_property_t *)map_get_((map_base_t *)cfg,name);
  (cfg->properties).ref = pgVar1;
  if ((pgVar1 == (golf_config_property_t *)0x0) || (pgVar1->type != GOLF_CONFIG_PROPERTY_NUM)) {
    golf_log_warning("Invalid config property %s",name);
    fVar2 = 0.0;
  }
  else {
    fVar2 = (pgVar1->field_1).num_val;
  }
  return fVar2;
}

Assistant:

float golf_config_get_num(golf_config_t *cfg, const char *name) {
    golf_config_property_t *prop = map_get(&cfg->properties, name);
    if (prop && prop->type == GOLF_CONFIG_PROPERTY_NUM) {
        return prop->num_val;
    }
    else {
        golf_log_warning("Invalid config property %s", name);
        return 0.0f;
    }
}